

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O1

Matrix<float,_2,_2> __thiscall
tcu::operator*(tcu *this,Matrix<float,_2,_3> *a,Matrix<float,_3,_2> *b)

{
  long lVar1;
  Matrix<float,_2,_2> *res;
  tcu *ptVar2;
  int col;
  long lVar3;
  Vector<float,_3> *pVVar4;
  int ndx;
  long lVar5;
  bool bVar6;
  float v;
  undefined4 uVar7;
  Matrix<float,_2,_2> MVar8;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  lVar1 = 0;
  ptVar2 = this;
  do {
    lVar3 = 0;
    do {
      uVar7 = 0x3f800000;
      if (lVar1 != lVar3) {
        uVar7 = 0;
      }
      *(undefined4 *)(ptVar2 + lVar3 * 8) = uVar7;
      lVar3 = lVar3 + 1;
    } while (lVar3 == 1);
    ptVar2 = ptVar2 + 4;
    bVar6 = lVar1 == 0;
    lVar1 = lVar1 + 1;
  } while (bVar6);
  lVar1 = 0;
  do {
    pVVar4 = (Vector<float,_3> *)b;
    lVar3 = 0;
    do {
      MVar8.m_data.m_data[0].m_data[0] = 0.0;
      lVar5 = 0;
      do {
        MVar8.m_data.m_data[1].m_data[0] =
             *(float *)((long)a + lVar5 * 2 * 4) *
             ((Vector<tcu::Vector<float,_3>,_2> *)pVVar4->m_data)->m_data[0].m_data[lVar5];
        MVar8.m_data.m_data[0].m_data[0] =
             MVar8.m_data.m_data[0].m_data[0] + MVar8.m_data.m_data[1].m_data[0];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      *(float *)(this + lVar3 * 8 + lVar1 * 4) = MVar8.m_data.m_data[0].m_data[0];
      pVVar4 = pVVar4 + 1;
      bVar6 = lVar3 == 0;
      lVar3 = lVar3 + 1;
    } while (bVar6);
    a = (Matrix<float,_2,_3> *)((long)a + 4);
    bVar6 = lVar1 == 0;
    lVar1 = lVar1 + 1;
  } while (bVar6);
  MVar8.m_data.m_data[0].m_data[1] = 0.0;
  MVar8.m_data.m_data[1].m_data[1] = 0.0;
  return (Matrix<float,_2,_2>)MVar8.m_data.m_data;
}

Assistant:

Matrix<T, Rows0, Cols1> operator* (const Matrix<T, Rows0, Cols0>& a, const Matrix<T, Rows1, Cols1>& b)
{
	DE_STATIC_ASSERT(Cols0 == Rows1);
	Matrix<T, Rows0, Cols1> res;
	for (int row = 0; row < Rows0; row++)
	{
		for (int col = 0; col < Cols1; col++)
		{
			T v = T(0);
			for (int ndx = 0; ndx < Cols0; ndx++)
				v += a(row,ndx) * b(ndx,col);
			res(row,col) = v;
		}
	}
	return res;
}